

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# textreader.hpp
# Opt level: O0

void __thiscall TextReader::read_symbol(TextReader *this,char value)

{
  char cVar1;
  bool bVar2;
  allocator local_d9;
  string local_d8 [39];
  allocator local_b1;
  string local_b0 [55];
  allocator local_79;
  string local_78 [32];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_58 [32];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_38 [39];
  char local_11;
  TextReader *pTStack_10;
  char value_local;
  TextReader *this_local;
  
  local_11 = value;
  pTStack_10 = this;
  bVar2 = is_symbol(this,value);
  if (bVar2) {
    skip_symbol(this);
  }
  else {
    std::allocator<char>::allocator();
    std::__cxx11::string::string(local_78,"Expect \"",&local_79);
    cVar1 = local_11;
    std::allocator<char>::allocator();
    std::__cxx11::string::string(local_b0,1,cVar1,&local_b1);
    std::operator+(local_58,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                            local_78);
    std::allocator<char>::allocator();
    std::__cxx11::string::string(local_d8,"\" symbol",&local_d9);
    std::operator+(local_38,local_58);
    parse_error(this,local_38);
    std::__cxx11::string::~string((string *)local_38);
    std::__cxx11::string::~string(local_d8);
    std::allocator<char>::~allocator((allocator<char> *)&local_d9);
    std::__cxx11::string::~string((string *)local_58);
    std::__cxx11::string::~string(local_b0);
    std::allocator<char>::~allocator((allocator<char> *)&local_b1);
    std::__cxx11::string::~string(local_78);
    std::allocator<char>::~allocator((allocator<char> *)&local_79);
  }
  return;
}

Assistant:

inline void read_symbol(const char value) {
        if (is_symbol(value))
            skip_symbol();
        else
            parse_error(std::string("Expect \"") + std::string(1, value) + std::string("\" symbol"));
    }